

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

Status GetStatus(Status *s)

{
  Status *in_RSI;
  Status *s_local;
  
  absl::lts_20250127::Status::Status(s,in_RSI);
  return (Status)(uintptr_t)s;
}

Assistant:

absl::Status GetStatus(const absl::Status& s) { return s; }